

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::
field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>,pstack::Elf::Object_const*>
          (JObject *this,char (*k) [9],
          Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
          *v,Object **c)

{
  ostream *os;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  local_40;
  Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>
  field;
  
  local_40.container =
       (map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
        *)k;
  field.k = (char (*) [9])v;
  os = std::operator<<(this->os,this->sep);
  field.v = &local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[9],_pstack::Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>_>,_const_pstack::Elf::Object_*>
                         *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }